

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O3

void __thiscall
S2VertexIdLaxLoopShape::S2VertexIdLaxLoopShape
          (S2VertexIdLaxLoopShape *this,vector<int,_std::allocator<int>_> *vertex_ids,
          S2Point *vertex_array)

{
  (this->super_S2Shape).id_ = -1;
  (this->super_S2Shape)._vptr_S2Shape = (_func_int **)&PTR__S2VertexIdLaxLoopShape_002bc170;
  (this->vertex_ids_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  Init(this,vertex_ids,vertex_array);
  return;
}

Assistant:

S2VertexIdLaxLoopShape::S2VertexIdLaxLoopShape(
    const std::vector<int32>& vertex_ids, const S2Point* vertex_array) {
  Init(vertex_ids, vertex_array);
}